

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O2

void import_append_char(ImportCtx *p,int c)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = p->n;
  iVar3 = iVar2 + 1;
  if (iVar3 < p->nAlloc) {
    pcVar1 = p->z;
  }
  else {
    iVar3 = p->nAlloc * 2 + 100;
    p->nAlloc = iVar3;
    pcVar1 = (char *)duckdb_shell_sqlite3_realloc64(p->z,(long)iVar3);
    p->z = pcVar1;
    if (pcVar1 == (char *)0x0) {
      shell_out_of_memory();
    }
    iVar2 = p->n;
    iVar3 = iVar2 + 1;
  }
  p->n = iVar3;
  pcVar1[iVar2] = (char)c;
  return;
}

Assistant:

static void import_append_char(ImportCtx *p, int c) {
	if (p->n + 1 >= p->nAlloc) {
		p->nAlloc += p->nAlloc + 100;
		p->z = (char *)sqlite3_realloc64(p->z, p->nAlloc);
		if (p->z == 0)
			shell_out_of_memory();
	}
	p->z[p->n++] = (char)c;
}